

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

int RGBToYUVComponent(int r,int g,int b,int *coeffs,int sfix)

{
  int luma;
  int srounder;
  int sfix_local;
  int *coeffs_local;
  int b_local;
  int g_local;
  int r_local;
  
  return *coeffs * r + coeffs[1] * g + coeffs[2] * b + coeffs[3] + (1 << ((char)sfix + 0xfU & 0x1f))
         >> ((char)sfix + 0x10U & 0x1f);
}

Assistant:

static WEBP_INLINE int RGBToYUVComponent(int r, int g, int b,
                                         const int coeffs[4], int sfix) {
  const int srounder = 1 << (YUV_FIX + sfix - 1);
  const int luma = coeffs[0] * r + coeffs[1] * g + coeffs[2] * b +
                   coeffs[3] + srounder;
  return (luma >> (YUV_FIX + sfix));
}